

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

void strRev(char *str)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  
  sVar2 = strlen(str);
  if (1 < sVar2) {
    uVar3 = 1;
    do {
      sVar2 = sVar2 - 1;
      bVar4 = str[uVar3 - 1];
      bVar1 = str[sVar2];
      str[uVar3 - 1] = bVar4 ^ bVar1;
      bVar4 = bVar4 ^ bVar1 ^ str[sVar2];
      str[sVar2] = bVar4;
      str[uVar3 - 1] = str[uVar3 - 1] ^ bVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

void strRev(char* str)
{
	size_t i, j;
	ASSERT(strIsValid(str));
	for (i = 0, j = strLen(str); i + 1 < j;)
	{
		str[i] ^= str[--j];
		str[j] ^= str[i];
		str[i++] ^= str[j];
	}
}